

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O2

c_int osqp_update_lin_cost(OSQPWorkspace *work,c_float *q_new)

{
  c_float *b;
  c_int cVar1;
  c_float cVar2;
  
  if (work != (OSQPWorkspace *)0x0) {
    if (work->clear_update_time == 1) {
      work->clear_update_time = 0;
      work->info->update_time = 0.0;
    }
    osqp_tic(work->timer);
    prea_vec_copy(q_new,work->data->q,work->data->n);
    if (work->settings->scaling != 0) {
      b = work->data->q;
      vec_ew_prod(work->scaling->D,b,b,work->data->n);
      vec_mult_scalar(work->data->q,work->scaling->c,work->data->n);
    }
    reset_info(work->info);
    cVar2 = osqp_toc(work->timer);
    work->info->update_time = cVar2 + work->info->update_time;
    return 0;
  }
  cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_lin_cost");
  return cVar1;
}

Assistant:

c_int osqp_update_lin_cost(OSQPWorkspace *work, const c_float *q_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Replace q by the new vector
  prea_vec_copy(q_new, work->data->q, work->data->n);

  // Scaling
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->D, work->data->q, work->data->q, work->data->n);
    vec_mult_scalar(work->data->q, work->scaling->c, work->data->n);
  }

  // Reset solver information
  reset_info(work->info);

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return 0;
}